

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

size_t __thiscall Memory::HeapInfo::GetSmallHeapBlockCount(HeapInfo *this,bool checkCount)

{
  HeapBucketGroup<SmallAllocationBlockAttributes> *this_00;
  HeapBucketGroup<MediumAllocationBlockAttributes> *this_01;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  RecyclerSweepManager *this_02;
  undefined4 *puVar3;
  code *pcVar4;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *pSVar8;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *pSVar9;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar10;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar11;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar12;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *pSVar13;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar14;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar15;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar16;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined8 *in_FS_OFFSET;
  
  lVar18 = 0x78;
  lVar19 = 0;
  do {
    this_00 = (HeapBucketGroup<SmallAllocationBlockAttributes> *)
              ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
              lVar18);
    sVar6 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetNonEmptyHeapBlockCount
                      (this_00,checkCount);
    sVar7 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetEmptyHeapBlockCount(this_00);
    lVar19 = sVar7 + sVar6 + lVar19;
    lVar18 = lVar18 + 0x380;
  } while (lVar18 != 0xa878);
  lVar18 = 0xa878;
  do {
    this_01 = (HeapBucketGroup<MediumAllocationBlockAttributes> *)
              ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
              lVar18);
    sVar6 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetNonEmptyHeapBlockCount
                      (this_01,checkCount);
    sVar7 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetEmptyHeapBlockCount(this_01);
    lVar19 = sVar7 + sVar6 + lVar19;
    lVar18 = lVar18 + 0x380;
  } while (lVar18 != 0x10df8);
  pSVar8 = this->newLeafHeapBlockList;
  lVar18 = 0;
  while (pSVar8 != (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pSVar1 = (pSVar8->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar8 = (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar8 = HeapBlock::AsLeafBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
    }
    lVar18 = lVar18 + 1;
  }
  pSVar9 = this->newNormalHeapBlockList;
  lVar20 = 0;
  while (pSVar9 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pSVar1 = (pSVar9->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar9 = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar9 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
    }
    lVar20 = lVar20 + 1;
  }
  pSVar10 = this->newFinalizableHeapBlockList;
  lVar21 = 0;
  while (pSVar10 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pSVar1 = (pSVar10->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar10 = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar10 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->super_HeapBlock);
    }
    lVar21 = lVar21 + 1;
  }
  pSVar11 = this->newNormalWithBarrierHeapBlockList;
  lVar22 = 0;
  while (pSVar11 != (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pSVar1 = (pSVar11->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar11 = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar11 = HeapBlock::AsNormalWriteBarrierBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->super_HeapBlock);
    }
    lVar22 = lVar22 + 1;
  }
  pSVar12 = this->newFinalizableWithBarrierHeapBlockList;
  lVar23 = 0;
  while (pSVar12 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pSVar1 = (pSVar12->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar12 = (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar12 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->super_HeapBlock);
    }
    lVar23 = lVar23 + 1;
  }
  pSVar13 = this->newMediumLeafHeapBlockList;
  lVar24 = 0;
  while (pSVar13 != (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pSVar2 = (pSVar13->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      pSVar13 = (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar13 = HeapBlock::AsLeafBlock<MediumAllocationBlockAttributes>(&pSVar2->super_HeapBlock);
    }
    lVar24 = lVar24 + 1;
  }
  pSVar14 = this->newMediumNormalHeapBlockList;
  lVar25 = 0;
  while (pSVar14 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pSVar2 = (pSVar14->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      pSVar14 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar14 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar2->super_HeapBlock);
    }
    lVar25 = lVar25 + 1;
  }
  pSVar15 = this->newMediumFinalizableHeapBlockList;
  lVar26 = 0;
  while (pSVar15 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pSVar2 = (pSVar15->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      pSVar15 = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar15 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->super_HeapBlock);
    }
    lVar26 = lVar26 + 1;
  }
  pSVar16 = this->newMediumNormalWithBarrierHeapBlockList;
  lVar27 = 0;
  while (pSVar16 != (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pSVar2 = (pSVar16->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      pSVar16 = (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar16 = HeapBlock::AsNormalWriteBarrierBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->super_HeapBlock);
    }
    lVar27 = lVar27 + 1;
  }
  pSVar17 = this->newMediumFinalizableWithBarrierHeapBlockList;
  lVar28 = 0;
  while (pSVar17 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pSVar2 = (pSVar17->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      pSVar17 = (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar17 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->super_HeapBlock);
    }
    lVar28 = lVar28 + 1;
  }
  sVar6 = lVar18 + lVar19 + lVar20 + lVar21 + lVar22 + lVar23 + lVar24 + lVar25 + lVar26 + lVar27 +
          lVar28;
  if ((this->recycler != (Recycler *)0x0) &&
     (this_02 = this->recycler->recyclerSweepManager, this_02 != (RecyclerSweepManager *)0x0)) {
    bVar5 = RecyclerSweepManager::IsBackground(this_02);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)*in_FS_OFFSET;
      *puVar3 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                         ,0x68c,"(!this->recycler->recyclerSweepManager->IsBackground())",
                         "!this->recycler->recyclerSweepManager->IsBackground()");
      if (!bVar5) goto LAB_00240c7b;
      *puVar3 = 0;
    }
    sVar7 = RecyclerSweepManager::GetPendingMergeNewHeapBlockCount
                      (this->recycler->recyclerSweepManager,this);
    sVar6 = sVar6 + sVar7;
  }
  if ((checkCount) &&
     (sVar6 != this->heapBlockCount[2] + this->heapBlockCount[1] + this->heapBlockCount[3] +
               this->heapBlockCount[6] + this->heapBlockCount[7] + this->heapBlockCount[8] +
               this->heapBlockCount[4] + this->heapBlockCount[5] + this->heapBlockCount[9] +
               this->heapBlockCount[10])) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x6a6,
                       "(!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount)",
                       "!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount");
    if (!bVar5) {
LAB_00240c7b:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar3 = 0;
  }
  return sVar6;
}

Assistant:

size_t
HeapInfo::GetSmallHeapBlockCount(bool checkCount) const
{
    size_t currentSmallHeapBlockCount = 0;
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        currentSmallHeapBlockCount += heapBuckets[i].GetNonEmptyHeapBlockCount(checkCount);
        currentSmallHeapBlockCount += heapBuckets[i].GetEmptyHeapBlockCount();
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetNonEmptyHeapBlockCount(checkCount);
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetEmptyHeapBlockCount();
    }
#endif

#if ENABLE_CONCURRENT_GC
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newLeafHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newNormalHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newFinalizableHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newRecyclerVisitedHostHeapBlockList);
#endif
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newFinalizableWithBarrierHeapBlockList);
#endif

    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumLeafHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumNormalHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumRecyclerVisitedHostHeapBlockList);
#endif
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumFinalizableHeapBlockList);
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumFinalizableWithBarrierHeapBlockList);
#endif

    // TODO: Update recycler sweep
    // Recycler can be null if we have OOM in the ctor
    if (this->recycler && this->recycler->recyclerSweepManager != nullptr)
    {
        // This function can't be called in the background
        Assert(!this->recycler->recyclerSweepManager->IsBackground());
        currentSmallHeapBlockCount += this->recycler->recyclerSweepManager->GetPendingMergeNewHeapBlockCount(this);
    }
#endif
#ifdef RECYCLER_SLOW_CHECK_ENABLED
    size_t expectedHeapBlockCount =
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockType]
#ifdef RECYCLER_VISITED_HOST
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType]
#endif
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockType];


#ifdef RECYCLER_WRITE_BARRIER
    expectedHeapBlockCount +=
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType];

#endif
    Assert(!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount);
#endif

    return currentSmallHeapBlockCount;
}